

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.h
# Opt level: O0

void __thiscall caldate_t::set_julian_date(caldate_t *this,int jy,int jm,int jd)

{
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  caldate_t *unaff_retaddr;
  div_t mq;
  undefined8 local_1c;
  undefined4 local_10;
  undefined4 local_c;
  int32_t dayno;
  
  dayno = (int32_t)((ulong)in_RDI >> 0x20);
  local_1c = div(in_EDX + -1,0xc);
  if (local_1c._4_4_ < 1) {
    local_1c._4_4_ = local_1c._4_4_ + 0xc;
    local_1c._0_4_ = (int)local_1c + -1;
  }
  local_10 = local_1c._4_4_ + 1;
  local_c = (int)local_1c + in_ESI;
  if (local_10 < 3) {
    local_c = local_c + -1;
    local_10 = local_1c._4_4_ + 0xd;
  }
  floor((double)(local_c + 0x126c) * 365.25);
  floor((double)(local_10 + 1) * 30.6001);
  set_dayno(unaff_retaddr,dayno);
  return;
}

Assistant:

void set_julian_date(int jy, int jm, int jd)
    {
        /* adjust the month to 1-12 range */
        div_t mq = div(jm - 1, 12);
        if (mq.rem <= 0)
            mq.rem += 12, mq.quot -= 1;
        jm = mq.rem + 1;
        jy += mq.quot;
        

        /* 
         *   Calculate the Julian day number for the julian date, then
         *   subtract our Epoch's Julian day number to get our day number.
         */
        if (jm <= 2)
        {
            jy -= 1;
            jm += 12;
        }
        set_dayno((int32_t)(floor(365.25 * (jy + 4716))
                            + floor(30.6001 * (jm + 1))
                            + jd - 1524.5 - 1721119.5));
    }